

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

string * cmSystemTools::FileExistsInParentDirectories
                   (string *__return_storage_ptr__,string *fname,string *directory,string *toplevel)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string dir;
  string prevDir;
  string file;
  string local_c8;
  undefined1 *local_a8;
  pointer local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  string local_88;
  string *local_68;
  string local_60;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  pcVar2 = (fname->_M_dataplus)._M_p;
  local_68 = toplevel;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + fname->_M_string_length);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_88);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  pcVar2 = (directory->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar2,pcVar2 + directory->_M_string_length);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_c8);
  local_a8 = &local_98;
  local_a0 = (pointer)0x0;
  local_98 = 0;
  paVar1 = &__return_storage_ptr__->field_2;
  do {
    sVar3 = local_c8._M_string_length;
    if ((pointer)local_c8._M_string_length == local_a0) {
      if ((pointer)local_c8._M_string_length == (pointer)0x0) goto LAB_001de400;
      iVar5 = bcmp(local_c8._M_dataplus._M_p,local_a8,local_c8._M_string_length);
      if (iVar5 == 0) goto LAB_001de400;
    }
    local_60._M_dataplus._M_p = (pointer)sVar3;
    local_60._M_string_length = (size_type)local_c8._M_dataplus._M_p;
    local_60.field_2._M_allocated_capacity = 1;
    local_60.field_2._8_8_ = (long)"in Json::Value::setComment(): Comments must start with /" + 0x37
    ;
    local_40 = local_88._M_string_length;
    local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_88._M_dataplus._M_p;
    views._M_len = 3;
    views._M_array = (iterator)&local_60;
    cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
    bVar4 = cmsys::SystemTools::FileExists(__return_storage_ptr__);
    iVar5 = 1;
    if ((!bVar4) && (iVar5 = 3, (pointer)local_68->_M_string_length <= local_c8._M_string_length)) {
      std::__cxx11::string::_M_assign((string *)&local_a8);
      cmsys::SystemTools::GetParentDirectory(&local_60,&local_c8);
      std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      iVar5 = 0;
    }
    if ((!bVar4) &&
       (pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar2 != paVar1)) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
  } while (iVar5 == 0);
  if (iVar5 == 3) {
LAB_001de400:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::FileExistsInParentDirectories(
  const std::string& fname, const std::string& directory,
  const std::string& toplevel)
{
  std::string file = fname;
  cmSystemTools::ConvertToUnixSlashes(file);
  std::string dir = directory;
  cmSystemTools::ConvertToUnixSlashes(dir);
  std::string prevDir;
  while (dir != prevDir) {
    std::string path = cmStrCat(dir, "/", file);
    if (cmSystemTools::FileExists(path)) {
      return path;
    }
    if (dir.size() < toplevel.size()) {
      break;
    }
    prevDir = dir;
    dir = cmSystemTools::GetParentDirectory(dir);
  }
  return "";
}